

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

SrcList * sqlite3SrcListAppendFromTerm
                    (Parse *pParse,SrcList *p,Token *pTable,Token *pDatabase,Token *pAlias,
                    Select *pSubquery,Expr *pOn,IdList *pUsing)

{
  sqlite3 *db;
  SrcList *pSVar1;
  long lVar2;
  char *pcVar3;
  
  db = pParse->db;
  if (p == (SrcList *)0x0) {
    if (pOn != (Expr *)0x0 || pUsing != (IdList *)0x0) {
      pcVar3 = "USING";
      if (pOn != (Expr *)0x0) {
        pcVar3 = "ON";
      }
      sqlite3ErrorMsg(pParse,"a JOIN clause is required before %s",pcVar3);
      goto LAB_0017c1ec;
    }
    p = (SrcList *)0x0;
  }
  pSVar1 = sqlite3SrcListAppend(db,p,pTable,pDatabase);
  if ((pSVar1 != (SrcList *)0x0) && (lVar2 = (long)pSVar1->nSrc, lVar2 != 0)) {
    if (pAlias->n != 0) {
      pcVar3 = sqlite3NameFromToken(db,pAlias);
      pSVar1->a[lVar2 + -1].zAlias = pcVar3;
    }
    pSVar1->a[lVar2 + -1].pSelect = pSubquery;
    pSVar1->a[lVar2 + -1].pOn = pOn;
    pSVar1->a[lVar2 + -1].pUsing = pUsing;
    return pSVar1;
  }
LAB_0017c1ec:
  sqlite3ExprDelete(db,pOn);
  sqlite3IdListDelete(db,pUsing);
  sqlite3SelectDelete(db,pSubquery);
  return (SrcList *)0x0;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListAppendFromTerm(
  Parse *pParse,          /* Parsing context */
  SrcList *p,             /* The left part of the FROM clause already seen */
  Token *pTable,          /* Name of the table to add to the FROM clause */
  Token *pDatabase,       /* Name of the database containing pTable */
  Token *pAlias,          /* The right-hand side of the AS subexpression */
  Select *pSubquery,      /* A subquery used in place of a table name */
  Expr *pOn,              /* The ON clause of a join */
  IdList *pUsing          /* The USING clause of a join */
){
  struct SrcList_item *pItem;
  sqlite3 *db = pParse->db;
  if( !p && (pOn || pUsing) ){
    sqlite3ErrorMsg(pParse, "a JOIN clause is required before %s", 
      (pOn ? "ON" : "USING")
    );
    goto append_from_error;
  }
  p = sqlite3SrcListAppend(db, p, pTable, pDatabase);
  if( p==0 || NEVER(p->nSrc==0) ){
    goto append_from_error;
  }
  pItem = &p->a[p->nSrc-1];
  assert( pAlias!=0 );
  if( pAlias->n ){
    pItem->zAlias = sqlite3NameFromToken(db, pAlias);
  }
  pItem->pSelect = pSubquery;
  pItem->pOn = pOn;
  pItem->pUsing = pUsing;
  return p;

 append_from_error:
  assert( p==0 );
  sqlite3ExprDelete(db, pOn);
  sqlite3IdListDelete(db, pUsing);
  sqlite3SelectDelete(db, pSubquery);
  return 0;
}